

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O0

void __thiscall intel_keym_v1_t::km_hash_t::_read(km_hash_t *this)

{
  kstream *this_00;
  uint16_t uVar1;
  string local_30;
  km_hash_t *local_10;
  km_hash_t *this_local;
  
  local_10 = this;
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_hash_algorithm_id = uVar1;
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_len_hash = uVar1;
  this_00 = (this->super_kstruct).m__io;
  uVar1 = len_hash(this);
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,this_00,(ulong)uVar1);
  std::__cxx11::string::operator=((string *)&this->m_hash,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void intel_keym_v1_t::km_hash_t::_read() {
    m_hash_algorithm_id = m__io->read_u2le();
    m_len_hash = m__io->read_u2le();
    m_hash = m__io->read_bytes(len_hash());
}